

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_device_init__null
                    (ma_device *pDevice,ma_device_config *pConfig,
                    ma_device_descriptor *pDescriptorPlayback,
                    ma_device_descriptor *pDescriptorCapture)

{
  ma_uint32 mVar1;
  ma_uint32 local_5c;
  ma_uint32 local_58;
  ma_format local_54;
  ma_uint32 local_50;
  ma_uint32 local_4c;
  ma_format local_48;
  ma_result result;
  ma_device_descriptor *pDescriptorCapture_local;
  ma_device_descriptor *pDescriptorPlayback_local;
  ma_device_config *pConfig_local;
  ma_device *pDevice_local;
  
  if (pDevice != (ma_device *)0x0) {
    memset(&pDevice->field_24,0,0x160);
    if (pConfig->deviceType == ma_device_type_loopback) {
      pDevice_local._4_4_ = MA_DEVICE_TYPE_NOT_SUPPORTED;
    }
    else {
      if ((pConfig->deviceType == ma_device_type_capture) ||
         (pConfig->deviceType == ma_device_type_duplex)) {
        if (pDescriptorCapture->format == ma_format_unknown) {
          local_48 = ma_format_f32;
        }
        else {
          local_48 = pDescriptorCapture->format;
        }
        pDescriptorCapture->format = local_48;
        if (pDescriptorCapture->channels == 0) {
          local_4c = 2;
        }
        else {
          local_4c = pDescriptorCapture->channels;
        }
        pDescriptorCapture->channels = local_4c;
        if (pDescriptorCapture->sampleRate == 0) {
          local_50 = 48000;
        }
        else {
          local_50 = pDescriptorCapture->sampleRate;
        }
        pDescriptorCapture->sampleRate = local_50;
        if (pDescriptorCapture->channelMap[0] == '\0') {
          ma_channel_map_init_standard
                    (ma_standard_channel_map_default,pDescriptorCapture->channelMap,0xfe,
                     pDescriptorCapture->channels);
        }
        mVar1 = ma_calculate_buffer_size_in_frames_from_descriptor
                          (pDescriptorCapture,pDescriptorCapture->sampleRate,
                           pConfig->performanceProfile);
        pDescriptorCapture->periodSizeInFrames = mVar1;
      }
      if ((pConfig->deviceType == ma_device_type_playback) ||
         (pConfig->deviceType == ma_device_type_duplex)) {
        if (pDescriptorPlayback->format == ma_format_unknown) {
          local_54 = ma_format_f32;
        }
        else {
          local_54 = pDescriptorPlayback->format;
        }
        pDescriptorPlayback->format = local_54;
        if (pDescriptorPlayback->channels == 0) {
          local_58 = 2;
        }
        else {
          local_58 = pDescriptorPlayback->channels;
        }
        pDescriptorPlayback->channels = local_58;
        if (pDescriptorPlayback->sampleRate == 0) {
          local_5c = 48000;
        }
        else {
          local_5c = pDescriptorPlayback->sampleRate;
        }
        pDescriptorPlayback->sampleRate = local_5c;
        if (pDescriptorPlayback->channelMap[0] == '\0') {
          ma_channel_map_init_standard
                    (ma_standard_channel_map_default,pDescriptorPlayback->channelMap,0xfe,
                     pDescriptorPlayback->channels);
        }
        mVar1 = ma_calculate_buffer_size_in_frames_from_descriptor
                          (pDescriptorPlayback,pDescriptorPlayback->sampleRate,
                           pConfig->performanceProfile);
        pDescriptorPlayback->periodSizeInFrames = mVar1;
      }
      pDevice_local._4_4_ = ma_event_init(&(pDevice->field_24).null_device.operationEvent);
      if ((((pDevice_local._4_4_ == MA_SUCCESS) &&
           (pDevice_local._4_4_ =
                 ma_event_init(&(pDevice->field_24).null_device.operationCompletionEvent),
           pDevice_local._4_4_ == MA_SUCCESS)) &&
          (pDevice_local._4_4_ =
                ma_semaphore_init(L'\x01',&(pDevice->field_24).null_device.operationSemaphore),
          pDevice_local._4_4_ == MA_SUCCESS)) &&
         (pDevice_local._4_4_ =
               ma_thread_create((ma_thread *)&pDevice->field_24,pDevice->pContext->threadPriority,0,
                                ma_device_thread__null,pDevice,
                                &pDevice->pContext->allocationCallbacks),
         pDevice_local._4_4_ == MA_SUCCESS)) {
        pDevice_local._4_4_ = MA_SUCCESS;
      }
    }
    return pDevice_local._4_4_;
  }
  __assert_fail("pDevice != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                ,0x1df4,
                "ma_result ma_device_init__null(ma_device *, const ma_device_config *, ma_device_descriptor *, ma_device_descriptor *)"
               );
}

Assistant:

static ma_result ma_device_init__null(ma_device* pDevice, const ma_device_config* pConfig, ma_device_descriptor* pDescriptorPlayback, ma_device_descriptor* pDescriptorCapture)
{
    ma_result result;

    MA_ASSERT(pDevice != NULL);

    MA_ZERO_OBJECT(&pDevice->null_device);

    if (pConfig->deviceType == ma_device_type_loopback) {
        return MA_DEVICE_TYPE_NOT_SUPPORTED;
    }

    /* The null backend supports everything exactly as we specify it. */
    if (pConfig->deviceType == ma_device_type_capture || pConfig->deviceType == ma_device_type_duplex) {
        pDescriptorCapture->format     = (pDescriptorCapture->format     != ma_format_unknown) ? pDescriptorCapture->format     : MA_DEFAULT_FORMAT;
        pDescriptorCapture->channels   = (pDescriptorCapture->channels   != 0)                 ? pDescriptorCapture->channels   : MA_DEFAULT_CHANNELS;
        pDescriptorCapture->sampleRate = (pDescriptorCapture->sampleRate != 0)                 ? pDescriptorCapture->sampleRate : MA_DEFAULT_SAMPLE_RATE;

        if (pDescriptorCapture->channelMap[0] == MA_CHANNEL_NONE) {
            ma_channel_map_init_standard(ma_standard_channel_map_default, pDescriptorCapture->channelMap, ma_countof(pDescriptorCapture->channelMap), pDescriptorCapture->channels);
        }

        pDescriptorCapture->periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_descriptor(pDescriptorCapture, pDescriptorCapture->sampleRate, pConfig->performanceProfile);
    }

    if (pConfig->deviceType == ma_device_type_playback || pConfig->deviceType == ma_device_type_duplex) {
        pDescriptorPlayback->format     = (pDescriptorPlayback->format     != ma_format_unknown) ? pDescriptorPlayback->format     : MA_DEFAULT_FORMAT;
        pDescriptorPlayback->channels   = (pDescriptorPlayback->channels   != 0)                 ? pDescriptorPlayback->channels   : MA_DEFAULT_CHANNELS;
        pDescriptorPlayback->sampleRate = (pDescriptorPlayback->sampleRate != 0)                 ? pDescriptorPlayback->sampleRate : MA_DEFAULT_SAMPLE_RATE;

        if (pDescriptorPlayback->channelMap[0] == MA_CHANNEL_NONE) {
            ma_channel_map_init_standard(ma_standard_channel_map_default, pDescriptorPlayback->channelMap, ma_countof(pDescriptorCapture->channelMap), pDescriptorPlayback->channels);
        }

        pDescriptorPlayback->periodSizeInFrames = ma_calculate_buffer_size_in_frames_from_descriptor(pDescriptorPlayback, pDescriptorPlayback->sampleRate, pConfig->performanceProfile);
    }

    /*
    In order to get timing right, we need to create a thread that does nothing but keeps track of the timer. This timer is started when the
    first period is "written" to it, and then stopped in ma_device_stop__null().
    */
    result = ma_event_init(&pDevice->null_device.operationEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_event_init(&pDevice->null_device.operationCompletionEvent);
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_semaphore_init(1, &pDevice->null_device.operationSemaphore);    /* <-- It's important that the initial value is set to 1. */
    if (result != MA_SUCCESS) {
        return result;
    }

    result = ma_thread_create(&pDevice->null_device.deviceThread, pDevice->pContext->threadPriority, 0, ma_device_thread__null, pDevice, &pDevice->pContext->allocationCallbacks);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}